

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chash.c
# Opt level: O0

void cf_hash(cf_chash *h,void *m,size_t nm,uint8_t *out)

{
  undefined1 local_190 [8];
  cf_chash_ctx ctx;
  uint8_t *out_local;
  size_t nm_local;
  void *m_local;
  cf_chash *h_local;
  
  ctx._352_8_ = out;
  out_local = (uint8_t *)nm;
  nm_local = (size_t)m;
  m_local = h;
  if (h == (cf_chash *)0x0) {
    abort();
  }
  (*h->init)(local_190);
  (**(code **)((long)m_local + 0x18))(local_190,nm_local,out_local);
  (**(code **)((long)m_local + 0x20))(local_190,ctx._352_8_);
  mem_clean(local_190,0x168);
  return;
}

Assistant:

void cf_hash(const cf_chash *h, const void *m, size_t nm, uint8_t *out)
{
  cf_chash_ctx ctx;
  assert(h);
  h->init(&ctx);
  h->update(&ctx, m, nm);
  h->digest(&ctx, out);
  mem_clean(&ctx, sizeof ctx);
}